

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O0

bool __thiscall IR::Opnd::IsArgumentsObject(Opnd *this)

{
  bool bVar1;
  StackSym *this_00;
  Instr *this_01;
  undefined1 local_19;
  StackSym *sym;
  Opnd *this_local;
  
  this_00 = GetStackSym(this);
  local_19 = false;
  if (this_00 != (StackSym *)0x0) {
    bVar1 = StackSym::IsSingleDef(this_00);
    local_19 = false;
    if (bVar1) {
      this_01 = StackSym::GetInstrDef(this_00);
      local_19 = Instr::HasAnyLoadHeapArgsOpCode(this_01);
    }
  }
  return local_19;
}

Assistant:

bool
Opnd::IsArgumentsObject()
{
    // returns "false" if the sym is not single def (happens when the parent function has formals); the opnd can still be the arguments object.
    // Since we need this information in the inliner where we don't track arguments object sym, going with single def is the best option.
    StackSym * sym = this->GetStackSym();

    return sym && sym->IsSingleDef() && sym->GetInstrDef()->HasAnyLoadHeapArgsOpCode();
}